

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpWithTcpClient.cpp
# Opt level: O1

void __thiscall
sznet::net::KcpWithTcpClient::KcpWithTcpClient
          (KcpWithTcpClient *this,EventLoop *loop,InetAddress *tcpServerAddr,string *nameArg,
          int kcpMode)

{
  pointer pcVar1;
  element_type *peVar2;
  ulong __n;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  EventLoop *pEVar6;
  Connector *this_00;
  undefined8 *puVar7;
  EventLoop *in_R9;
  int iVar8;
  SourceFile file;
  SourceFile file_00;
  undefined1 local_1028 [24];
  code *pcStack_1010;
  char *local_78 [5];
  ConnectorPtr *local_50;
  MutexLock *local_48;
  string *local_40;
  int local_34;
  
  file._8_8_ = 0x29;
  file.m_data = (char *)0x14;
  local_34 = kcpMode;
  pEVar6 = CheckNotNull<sznet::net::EventLoop>((sznet *)0x13b746,file,0x13a7dd,(char *)loop,in_R9);
  this->m_loop = pEVar6;
  this_00 = (Connector *)operator_new(0x70);
  Connector::Connector(this_00,loop,tcpServerAddr);
  local_50 = &this->m_tcpConnector;
  std::__shared_ptr<sznet::net::Connector,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<sznet::net::Connector,void>
            ((__shared_ptr<sznet::net::Connector,(__gnu_cxx::_Lock_policy)2> *)local_50,this_00);
  local_40 = &this->m_name;
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  pcVar1 = (nameArg->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_40,pcVar1,pcVar1 + nameArg->_M_string_length);
  *(undefined8 *)&(this->m_kcpConnectionCallback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_kcpConnectionCallback).super__Function_base._M_functor + 8) = 0;
  (this->m_kcpConnectionCallback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_kcpConnectionCallback)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->m_kcpMessageCallback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_kcpMessageCallback).super__Function_base._M_functor + 8) = 0;
  (this->m_kcpMessageCallback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_kcpMessageCallback)._M_invoker = (_Invoker_type)0x0;
  *(code **)&(this->m_kcpConnectionCallback).super__Function_base._M_functor =
       defaultKcpConnectionCallback;
  (this->m_kcpConnectionCallback)._M_invoker =
       std::
       _Function_handler<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&),_void_(*)(const_std::shared_ptr<sznet::net::KcpConnection>_&)>
       ::_M_invoke;
  (this->m_kcpConnectionCallback).super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&),_void_(*)(const_std::shared_ptr<sznet::net::KcpConnection>_&)>
       ::_M_manager;
  *(code **)&(this->m_kcpMessageCallback).super__Function_base._M_functor =
       defaultKcpMessageCallback;
  (this->m_kcpMessageCallback)._M_invoker =
       std::
       _Function_handler<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp),_void_(*)(const_std::shared_ptr<sznet::net::KcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp)>
       ::_M_invoke;
  (this->m_kcpMessageCallback).super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp),_void_(*)(const_std::shared_ptr<sznet::net::KcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp)>
       ::_M_manager;
  this->m_kcpWriteCompleteCallback = (KcpWriteCompleteCallback)(ZEXT432(0) << 0x40);
  this->m_tcpRetry = (__atomic_base<bool>)0x0;
  this->m_tcpConnect = (__atomic_base<bool>)0x1;
  this->m_nextConnId = 1;
  (this->m_mutex).m_holder = 0;
  sz_mutex_init(&(this->m_mutex).m_mutex);
  (this->m_tcpConnection).super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->m_tcpConnection).super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  _local_1028 = (function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_sznet::Timestamp)>
                 )(ZEXT432(0) << 0x40);
  local_48 = &this->m_mutex;
  puVar7 = (undefined8 *)operator_new(0x18);
  *puVar7 = handleTcpMessage;
  puVar7[1] = 0;
  puVar7[2] = this;
  local_1028._0_8_ = puVar7;
  local_1028._16_8_ =
       std::
       _Function_handler<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_sznet::Timestamp),_std::_Bind<void_(sznet::net::KcpWithTcpClient::*(sznet::net::KcpWithTcpClient_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_std::shared_ptr<sznet::net::TcpConnection>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_sznet::Timestamp)>_>
       ::_M_manager;
  pcStack_1010 = std::
                 _Function_handler<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_sznet::Timestamp),_std::_Bind<void_(sznet::net::KcpWithTcpClient::*(sznet::net::KcpWithTcpClient_*,_std::_Placeholder<1>,_std::_Placeholder<2>,_std::_Placeholder<3>))(const_std::shared_ptr<sznet::net::TcpConnection>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_sznet::Timestamp)>_>
                 ::_M_invoke;
  std::
  function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_sznet::Timestamp)>
  ::function(&(this->m_tcpCodec).m_messageCallback,
             (function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_sznet::Timestamp)>
              *)local_1028);
  if ((_Manager_type)local_1028._16_8_ != (_Manager_type)0x0) {
    (*(code *)local_1028._16_8_)((_Any_data *)local_1028,(_Any_data *)local_1028,__destroy_functor);
  }
  uVar3 = *(undefined8 *)&tcpServerAddr->field_0;
  uVar4 = *(undefined8 *)((long)&tcpServerAddr->field_0 + 8);
  uVar5 = *(undefined8 *)((long)&tcpServerAddr->field_0 + 0x14);
  *(undefined8 *)((long)&(this->m_udpListenAddr).field_0 + 0xc) =
       *(undefined8 *)((long)&tcpServerAddr->field_0 + 0xc);
  *(undefined8 *)((long)&(this->m_udpListenAddr).field_0 + 0x14) = uVar5;
  *(undefined8 *)&(this->m_udpListenAddr).field_0 = uVar3;
  *(undefined8 *)((long)&(this->m_udpListenAddr).field_0 + 8) = uVar4;
  (this->m_kcpConnection).super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>
       = (__shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>)(ZEXT816(0) << 0x20);
  this->m_kcpMode = local_34;
  peVar2 = (this->m_tcpConnector).
           super___shared_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  _local_1028 = (function<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_sznet::Timestamp)>
                 )(ZEXT832(0) << 0x20);
  puVar7 = (undefined8 *)operator_new(0x18);
  *puVar7 = newTcpConnection;
  puVar7[1] = 0;
  puVar7[2] = this;
  local_1028._0_8_ = puVar7;
  local_1028._16_8_ =
       std::
       _Function_handler<void_(int),_std::_Bind<void_(sznet::net::KcpWithTcpClient::*(sznet::net::KcpWithTcpClient_*,_std::_Placeholder<1>))(int)>_>
       ::_M_manager;
  pcStack_1010 = std::
                 _Function_handler<void_(int),_std::_Bind<void_(sznet::net::KcpWithTcpClient::*(sznet::net::KcpWithTcpClient_*,_std::_Placeholder<1>))(int)>_>
                 ::_M_invoke;
  std::function<void_(int)>::operator=
            (&peVar2->m_newConnectionCallback,(function<void_(int)> *)local_1028);
  if ((_Manager_type)local_1028._16_8_ != (_Manager_type)0x0) {
    (*(code *)local_1028._16_8_)((_Any_data *)local_1028,(_Any_data *)local_1028,__destroy_functor);
  }
  if (g_logLevel < 3) {
    file_00._8_8_ = 0x14;
    file_00.m_data = "KcpWithTcpClient.cpp";
    Logger::Logger((Logger *)local_1028,file_00,0x37);
    iVar8 = (int)local_78;
    if (0x23 < (uint)(iVar8 - (int)local_78[0])) {
      builtin_strncpy(local_78[0],"KcpWithTcpClient::KcpWithTcpClient[",0x23);
      local_78[0] = local_78[0] + 0x23;
    }
    __n = (this->m_name)._M_string_length;
    if (__n < (ulong)(long)(iVar8 - (int)local_78[0])) {
      memcpy(local_78[0],(local_40->_M_dataplus)._M_p,__n);
      local_78[0] = local_78[0] + __n;
    }
    if (0x12 < (uint)(iVar8 - (int)local_78[0])) {
      builtin_strncpy(local_78[0],"] - tcp connector ",0x12);
      local_78[0] = local_78[0] + 0x12;
    }
    LogStream::operator<<
              ((LogStream *)(local_1028 + 8),
               (local_50->super___shared_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr);
    Logger::~Logger((Logger *)local_1028);
  }
  return;
}

Assistant:

KcpWithTcpClient::KcpWithTcpClient(EventLoop* loop, const InetAddress& tcpServerAddr, const string& nameArg, int kcpMode):
	m_loop(CHECK_NOTNULL(loop)),
	m_tcpConnector(new Connector(loop, tcpServerAddr)),
    m_name(nameArg),
    m_kcpConnectionCallback(defaultKcpConnectionCallback),
    m_kcpMessageCallback(defaultKcpMessageCallback),
    m_tcpRetry(false),
    m_tcpConnect(true),
    m_nextConnId(1),
	m_tcpCodec(std::bind(&KcpWithTcpClient::handleTcpMessage, this, std::placeholders::_1, std::placeholders::_2, std::placeholders::_3)),
	m_udpListenAddr(tcpServerAddr),
	m_kcpMode(kcpMode)
{
	m_tcpConnector->setNewConnectionCallback(std::bind(&KcpWithTcpClient::newTcpConnection, this, std::placeholders::_1));
	// FIXME setConnectFailedCallback
	LOG_INFO << "KcpWithTcpClient::KcpWithTcpClient[" << m_name 
		<< "] - tcp connector " << get_pointer(m_tcpConnector);
}